

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O3

void __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::Finish
          (FlatBufferBuilderImpl<false> *this,uoffset_t root,char *file_identifier,bool size_prefix)

{
  uint *puVar1;
  uint8_t *puVar2;
  uoffset_t element;
  ulong uVar3;
  size_t sVar4;
  ulong alignment;
  
  if (this->finished == true) {
    __assert_fail("!finished",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                  ,0x4ec,
                  "void flatbuffers::FlatBufferBuilderImpl<>::Finish(uoffset_t, const char *, bool) [Is64Aware = false]"
                 );
  }
  NotNested(this);
  alignment = this->minalign_;
  (this->buf_).scratch_ = (this->buf_).buf_;
  uVar3 = (ulong)size_prefix * 4;
  if (alignment < uVar3) {
    this->minalign_ = uVar3;
    alignment = 4;
  }
  PreAlign(this,uVar3 + (ulong)(file_identifier != (char *)0x0) * 4 + 4,alignment);
  if (file_identifier != (char *)0x0) {
    sVar4 = strlen(file_identifier);
    if (sVar4 != 4) {
      __assert_fail("strlen(file_identifier) == kFileIdentifierLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                    ,0x4fc,
                    "void flatbuffers::FlatBufferBuilderImpl<>::Finish(uoffset_t, const char *, bool) [Is64Aware = false]"
                   );
    }
    vector_downward<unsigned_int>::ensure_space(&this->buf_,4);
    puVar2 = (this->buf_).cur_;
    (this->buf_).cur_ = puVar2 + -4;
    puVar1 = &(this->buf_).size_;
    *puVar1 = *puVar1 + 4;
    *(undefined4 *)(puVar2 + -4) = *(undefined4 *)file_identifier;
  }
  element = ReferTo(this,root);
  PushElement<unsigned_int,unsigned_int>(this,element);
  if (size_prefix) {
    PushElement<unsigned_int,unsigned_int>(this,(this->buf_).size_);
  }
  this->finished = true;
  return;
}

Assistant:

void Finish(uoffset_t root, const char *file_identifier, bool size_prefix) {
    // A buffer can only be finished once. To reuse a builder use `clear()`.
    FLATBUFFERS_ASSERT(!finished);

    NotNested();
    buf_.clear_scratch();

    const size_t prefix_size = size_prefix ? sizeof(SizeT) : 0;
    // Make sure we track the alignment of the size prefix.
    TrackMinAlign(prefix_size);

    const size_t root_offset_size = sizeof(uoffset_t);
    const size_t file_id_size = file_identifier ? kFileIdentifierLength : 0;

    // This will cause the whole buffer to be aligned.
    PreAlign(prefix_size + root_offset_size + file_id_size, minalign_);

    if (file_identifier) {
      FLATBUFFERS_ASSERT(strlen(file_identifier) == kFileIdentifierLength);
      PushBytes(reinterpret_cast<const uint8_t *>(file_identifier),
                kFileIdentifierLength);
    }
    PushElement(ReferTo(root));  // Location of root.
    if (size_prefix) { PushElement(GetSize()); }
    finished = true;
  }